

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O0

void __thiscall Scs::Server::SendAll(Server *this,void *data,size_t bytes)

{
  bool bVar1;
  vector<unsigned_char,Scs::Allocator<unsigned_char>> *this_00;
  element_type *this_01;
  reference psVar2;
  element_type *peVar3;
  undefined1 local_90 [8];
  shared_ptr<Scs::Server::ClientConnection> connection;
  iterator __end1;
  iterator __begin1;
  ClientConnectionList *__range1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>
  local_60;
  const_iterator local_58;
  undefined1 local_40 [8];
  BufferPtr buffer;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  size_t bytes_local;
  void *data_local;
  Server *this_local;
  
  lock._M_device = (mutex_type *)bytes;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->m_connectionListMutex);
  bVar1 = std::__cxx11::
          list<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
          ::empty(&this->m_connectionList);
  if (bVar1) {
    buffer.
    super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 1;
  }
  else {
    CreateBuffer();
    this_00 = (vector<unsigned_char,Scs::Allocator<unsigned_char>> *)
              std::
              __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_40);
    this_01 = std::
              __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_40);
    local_60._M_current =
         (uchar *)std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::end(this_01);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,Scs::Allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,Scs::Allocator<unsigned_char>>>
                *)&local_58,&local_60);
    std::vector<unsigned_char,Scs::Allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              (this_00,local_58,(uchar *)data,(uchar *)((long)data + (long)lock._M_device));
    __end1 = std::__cxx11::
             list<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
             ::begin(&this->m_connectionList);
    connection.super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::__cxx11::
         list<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
         ::end(&this->m_connectionList);
    while( true ) {
      bVar1 = std::operator!=(&__end1,(_Self *)&connection.
                                                super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount);
      if (!bVar1) break;
      psVar2 = std::_List_iterator<std::shared_ptr<Scs::Server::ClientConnection>_>::operator*
                         (&__end1);
      std::shared_ptr<Scs::Server::ClientConnection>::shared_ptr
                ((shared_ptr<Scs::Server::ClientConnection> *)local_90,psVar2);
      peVar3 = std::
               __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_90);
      SendQueue::Push(&peVar3->sendQueue,data,(size_t)lock._M_device);
      std::shared_ptr<Scs::Server::ClientConnection>::~shared_ptr
                ((shared_ptr<Scs::Server::ClientConnection> *)local_90);
      std::_List_iterator<std::shared_ptr<Scs::Server::ClientConnection>_>::operator++(&__end1);
    }
    std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::~shared_ptr
              ((shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_> *)local_40);
    buffer.
    super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void Server::SendAll(const void * data, size_t bytes)
{
	std::lock_guard<std::mutex> lock(m_connectionListMutex);
	if (m_connectionList.empty())
		return;
	BufferPtr buffer = CreateBuffer();
	buffer->insert(buffer->end(), static_cast<const uint8_t *>(data), static_cast<const uint8_t *>(data) + bytes);
	for (auto connection : m_connectionList)
		connection->sendQueue.Push(data, bytes);
}